

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastInlineStringCharCodeAt(Lowerer *this,Instr *instr,BuiltinFunction index)

{
  Instr *argoutInlineSpecialized;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  LabelInstr *doneLabel_00;
  LabelInstr *labelHelper_00;
  bool success;
  LabelInstr *labelHelper;
  LabelInstr *doneLabel;
  Opnd *pOStack_48;
  bool result;
  Opnd *argsOpnd [2];
  Instr *tmpInstr;
  Opnd *linkOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  BuiltinFunction index_local;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x524e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetSrc2(instr);
  pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  argoutInlineSpecialized = (pSVar6->field_5).m_instrDef;
  memset(&stack0xffffffffffffffb8,0,0x10);
  bVar2 = IR::Instr::FetchOperands(instr,&stack0xffffffffffffffb8,2);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5257,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  doneLabel_00 = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&doneLabel_00->super_Instr);
  labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
  pOVar4 = IR::Instr::GetDst(instr);
  bVar2 = GenerateFastCharAt(this,index,pOVar4,pOStack_48,argsOpnd[0],instr,instr,labelHelper_00,
                             doneLabel_00);
  IR::Instr::InsertBefore(instr,&labelHelper_00->super_Instr);
  if (bVar2) {
    InsertBranch(Br,true,doneLabel_00,&labelHelper_00->super_Instr);
    RelocateCallDirectToHelperPath(this,argoutInlineSpecialized,labelHelper_00);
  }
  return bVar2;
}

Assistant:

bool
Lowerer::GenerateFastInlineStringCharCodeAt(IR::Instr * instr, Js::BuiltinFunction index)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = {0};
    bool result  = instr->FetchOperands(argsOpnd, 2);
    Assert(result);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    bool success = GenerateFastCharAt(index, instr->GetDst(), argsOpnd[0], argsOpnd[1],
            instr, instr, labelHelper, doneLabel);

    instr->InsertBefore(labelHelper);
    if (!success)
    {
        return false;
    }

    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);

    return true;
}